

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

double __thiscall nonius::html_reporter::ideal_magnitude(html_reporter *this)

{
  double dVar1;
  pointer prVar2;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
  _Var3;
  __node_base *p_Var4;
  pointer prVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  mins;
  value_type d;
  
  mins.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mins.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mins.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  prVar5 = (this->runs).
           super__Vector_base<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ::reserve(&mins,(((long)(this->runs).
                          super__Vector_base<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)prVar5) / 0x70) *
                  (prVar5->data)._M_h._M_element_count);
  prVar2 = (this->runs).
           super__Vector_base<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (prVar5 = (this->runs).
                super__Vector_base<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
                ._M_impl.super__Vector_impl_data._M_start; prVar5 != prVar2; prVar5 = prVar5 + 1) {
    p_Var4 = &(prVar5->data)._M_h._M_before_begin;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
      ::pair(&d,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
                 *)(p_Var4 + 1));
      _Var3 = std::
              __min_element<__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1l>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (d.second.samples.
                         super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         d.second.samples.
                         super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
      ::push_back(&mins,_Var3._M_current);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
      ::~pair(&d);
    }
  }
  _Var3 = std::
          __min_element<__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1l>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (mins.
                     super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     mins.
                     super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  dVar1 = (_Var3._M_current)->__r;
  if (2.0 <= dVar1) {
    uVar6 = 0;
    uVar7 = 0x3ff00000;
  }
  else if (0.002 <= dVar1) {
    uVar6 = 0;
    uVar7 = 0x408f4000;
  }
  else {
    uVar6 = (undefined4)*(undefined8 *)(&DAT_0017d2e0 + (ulong)(dVar1 < 2e-06) * 8);
    uVar7 = (undefined4)((ulong)*(undefined8 *)(&DAT_0017d2e0 + (ulong)(dVar1 < 2e-06) * 8) >> 0x20)
    ;
  }
  std::
  _Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ::~_Vector_base(&mins.
                   super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                 );
  return (double)CONCAT44(uVar7,uVar6);
}

Assistant:

double ideal_magnitude() const {
            std::vector<fp_seconds> mins;
            mins.reserve(runs.size() * runs.front().data.size());
            for (auto&& r : runs) {
                for(auto d : r.data) {
                    mins.push_back(*std::min_element(d.second.samples.begin(), d.second.samples.end()));
                }
            }
            auto min = *std::min_element(mins.begin(), mins.end());
            return detail::get_magnitude(min);
        }